

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 auStack_78 [8];
  Ptr image2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 auStack_58 [8];
  Ptr image1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [3];
  allocator local_21;
  
  if (2 < argc) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SSE2 is enabled!");
    std::endl<char,std::char_traits<char>>(poVar1);
    auStack_58 = (undefined1  [8])0x0;
    image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    auStack_78 = (undefined1  [8])0x0;
    image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Loading ");
    poVar1 = std::operator<<(poVar1,argv[1]);
    poVar1 = std::operator<<(poVar1,"...");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string
              ((string *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,argv[1],&local_21);
    core::image::load_file
              ((image *)&image2.
                         super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,
               (string *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)auStack_58,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
               &image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__cxx11::string::~string
              ((string *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<unsigned_char>,void>
              (local_b8,(__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
                        auStack_58);
    core::image::rescale_half_size<unsigned_char>
              ((image *)&image1.
                         super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(ConstPtr *)local_b8);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)auStack_58,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
    poVar1 = std::operator<<((ostream *)&std::cout,"Loading ");
    poVar1 = std::operator<<(poVar1,argv[2]);
    poVar1 = std::operator<<(poVar1,"...");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string
              ((string *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,argv[2],&local_21);
    core::image::load_file
              ((image *)&image2.
                         super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,
               (string *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)auStack_78,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
               &image2.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__cxx11::string::~string
              ((string *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<unsigned_char>,void>
              (local_a8,(__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
                        auStack_78);
    core::image::rescale_half_size<unsigned_char>
              ((image *)&image1.
                         super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(ConstPtr *)local_a8);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)auStack_78,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
               &image1.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)auStack_78);
    feature_set_matching((Ptr *)&local_98,(Ptr *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&image2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&image1);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Syntax: ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," image1 image2");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (uint)(2 >= argc);
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 3)
    {
        std::cerr << "Syntax: " << argv[0] << " image1 image2" << std::endl;
        return 1;
    }

 // 用于加速
#ifdef __SSE2__
    std::cout << "SSE2 is enabled!" << std::endl;
#endif
#ifdef __SSE3__
    std::cout << "SSE3 is enabled!" << std::endl;
#endif

    /* Regular two-view matching. */
    core::ByteImage::Ptr image1, image2;
    try
    {
        std::cout << "Loading " << argv[1] << "..." << std::endl;
        image1 = core::image::load_file(std::string(argv[1]));
        // 图像尺寸减半
        image1 = core::image::rescale_half_size<uint8_t>(image1);
        //image1 = core::image::rescale_half_size<uint8_t>(image1);
        //image1 = core::image::rotate<uint8_t>(image1, core::image::ROTATE_CCW);

        std::cout << "Loading " << argv[2] << "..." << std::endl;
        image2 = core::image::load_file(argv[2]);
        // 图像尺寸减半
        image2 = core::image::rescale_half_size<uint8_t>(image2);
        //image2 = core::image::rescale_half_size<uint8_t>(image2);
        //image2 = core::image::rotate<uint8_t>(image2, core::image::ROTATE_CCW);
    }
    catch (std::exception& e)
    {
        std::cerr << "Error: " << e.what() << std::endl;
        return 1;
    }

    // 进行特征提取和特征匹配
    feature_set_matching(image1, image2);

    return 0;
}